

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O3

shared_ptr<gutil::PropertyNode> * __thiscall
gutil::PropertyNode::getChild(PropertyNode *this,string *_name)

{
  pointer __s1;
  size_t __n;
  element_type *peVar1;
  int iVar2;
  long lVar3;
  shared_ptr<gutil::PropertyNode> *psVar4;
  undefined1 local_41;
  shared_ptr<gutil::PropertyNode> local_40;
  
  psVar4 = (this->list).
           super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->list).
                super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 4;
    __s1 = (_name->_M_dataplus)._M_p;
    __n = _name->_M_string_length;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    do {
      peVar1 = (psVar4->super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (__n == (peVar1->name)._M_string_length) {
        if (__n == 0) {
          return psVar4;
        }
        iVar2 = bcmp(__s1,(peVar1->name)._M_dataplus._M_p,__n);
        if (iVar2 == 0) {
          return psVar4;
        }
      }
      psVar4 = psVar4 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  local_40.super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<gutil::PropertyNode,std::allocator<gutil::PropertyNode>,std::__cxx11::string_const&>
            (&local_40.super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(PropertyNode **)&local_40,(allocator<gutil::PropertyNode> *)&local_41,
             _name);
  std::
  vector<std::shared_ptr<gutil::PropertyNode>,std::allocator<std::shared_ptr<gutil::PropertyNode>>>
  ::emplace_back<std::shared_ptr<gutil::PropertyNode>>
            ((vector<std::shared_ptr<gutil::PropertyNode>,std::allocator<std::shared_ptr<gutil::PropertyNode>>>
              *)&this->list,&local_40);
  if (local_40.super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (this->list).
         super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
}

Assistant:

std::shared_ptr<PropertyNode> &getChild(const std::string &_name)
    {
      for (size_t i=0; i<list.size(); i++)
      {
        if (_name == list[i]->getName())
        {
          return list[i];
        }
      }

      list.push_back(std::make_shared<PropertyNode>(_name));

      return list.back();
    }